

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

size_t __thiscall
kj::
NoInfer_<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:56:51)>
::Type::operator()(void *this,size_t result)

{
  String local_1c8;
  Exception local_1b0;
  size_t local_20;
  size_t result_local;
  Type *this_local;
  
  this_local = (Type *)result;
  if (result < *this) {
    local_20 = result;
    result_local = (size_t)this;
    kj::_::Debug::makeDescription<char_const(&)[32]>
              (&local_1c8,(Debug *)"\"stream disconnected prematurely\"",
               "stream disconnected prematurely",(char (*) [32])this);
    Exception::Exception
              (&local_1b0,DISCONNECTED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3c,&local_1c8);
    throwRecoverableException(&local_1b0,0);
    Exception::~Exception(&local_1b0);
    String::~String(&local_1c8);
    memset((void *)(*(long *)((long)this + 8) + local_20),0,*this - local_20);
    this_local = *this;
  }
  return (size_t)this_local;
}

Assistant:

Promise<size_t> AsyncInputStream::read(void* buffer, size_t minBytes, size_t maxBytes) {
  return tryRead(buffer, minBytes, maxBytes).then([=](size_t result) {
    if (result >= minBytes) {
      return result;
    } else {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "stream disconnected prematurely"));
      // Pretend we read zeros from the input.
      memset(reinterpret_cast<byte*>(buffer) + result, 0, minBytes - result);
      return minBytes;
    }
  });
}